

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<(anonymous_namespace)::TileGroupTestLarge>
          (ParameterizedTestSuiteRegistry *this,char *test_suite_name,CodeLocation *code_location)

{
  pointer *pppPVar1;
  pointer ppPVar2;
  ParameterizedTestSuiteInfoBase *pPVar3;
  iterator __position;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge> *pPVar6;
  char *pcVar7;
  undefined8 uVar8;
  pointer ppPVar9;
  size_type __dnew;
  ParameterizedTestSuiteInfoBase local_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  int local_58;
  CodeLocation local_50;
  
  ppPVar9 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppPVar9 == ppPVar2) {
LAB_0053bfd0:
      pPVar6 = (ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge> *)
               operator_new(0x80);
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,*(long *)test_suite_name,
                 *(long *)(test_suite_name + 8) + *(long *)test_suite_name);
      local_58 = *(int *)(test_suite_name + 0x20);
      (pPVar6->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase =
           (_func_int **)&PTR__ParameterizedTestSuiteInfo_01016ea8;
      (pPVar6->test_suite_name_)._M_dataplus._M_p = (pointer)&(pPVar6->test_suite_name_).field_2;
      local_80._vptr_ParameterizedTestSuiteInfoBase = (_func_int **)&DAT_00000012;
      pcVar7 = (char *)std::__cxx11::string::_M_create
                                 ((ulong *)&pPVar6->test_suite_name_,(ulong)&local_80);
      (pPVar6->test_suite_name_)._M_dataplus._M_p = pcVar7;
      (pPVar6->test_suite_name_).field_2._M_allocated_capacity =
           (size_type)local_80._vptr_ParameterizedTestSuiteInfoBase;
      builtin_strncpy(pcVar7,"TileGroupTestLarge",0x12);
      (pPVar6->test_suite_name_)._M_string_length =
           (size_type)local_80._vptr_ParameterizedTestSuiteInfoBase;
      (pPVar6->test_suite_name_)._M_dataplus._M_p
      [(long)local_80._vptr_ParameterizedTestSuiteInfoBase] = '\0';
      (pPVar6->code_location_).file._M_dataplus._M_p =
           (pointer)&(pPVar6->code_location_).file.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pPVar6->code_location_,local_78,local_78 + local_70);
      (pPVar6->code_location_).line = local_58;
      (pPVar6->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pPVar6->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pPVar6->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pPVar6->instantiations_).
      super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::InstantiationInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pPVar6->instantiations_).
      super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::InstantiationInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pPVar6->instantiations_).
      super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>::InstantiationInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      __position._M_current =
           (this->test_suite_infos_).
           super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->test_suite_infos_).
          super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_80._vptr_ParameterizedTestSuiteInfoBase = (_func_int **)pPVar6;
        std::
        vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
        ::_M_realloc_insert<testing::internal::ParameterizedTestSuiteInfoBase*>
                  ((vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
                    *)this,__position,(ParameterizedTestSuiteInfoBase **)&local_80);
      }
      else {
        *__position._M_current = (ParameterizedTestSuiteInfoBase *)pPVar6;
        pppPVar1 = &(this->test_suite_infos_).
                    super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
      return pPVar6;
    }
    iVar5 = (*(*ppPVar9)->_vptr_ParameterizedTestSuiteInfoBase[2])();
    iVar5 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar5));
    if (iVar5 == 0) {
      iVar5 = (*(*ppPVar9)->_vptr_ParameterizedTestSuiteInfoBase[3])();
      if ((undefined1 *)CONCAT44(extraout_var_00,iVar5) !=
          &TypeIdHelper<(anonymous_namespace)::TileGroupTestLarge>::dummy_) {
        local_50.file._M_dataplus._M_p = (pointer)&local_50.file.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,*(long *)test_suite_name,
                   *(long *)(test_suite_name + 8) + *(long *)test_suite_name);
        local_50.line = *(int *)(test_suite_name + 0x20);
        ReportInvalidTestSuiteType("TileGroupTestLarge",&local_50);
        CodeLocation::~CodeLocation(&local_50);
        posix::Abort();
      }
      pPVar3 = *ppPVar9;
      if (pPVar3 == (ParameterizedTestSuiteInfoBase *)0x0) {
        uVar8 = __cxa_bad_typeid();
        GTestLog::~GTestLog((GTestLog *)&local_80);
        _Unwind_Resume(uVar8);
      }
      pcVar7 = *(char **)(pPVar3->_vptr_ParameterizedTestSuiteInfoBase[-1] + 8);
      if (pcVar7 == 
          "N7testing8internal26ParameterizedTestSuiteInfoIN12_GLOBAL__N_118TileGroupTestLargeEEE") {
        bVar4 = true;
      }
      else if (*pcVar7 == '*') {
        bVar4 = false;
      }
      else {
        iVar5 = strcmp(pcVar7,
                       "N7testing8internal26ParameterizedTestSuiteInfoIN12_GLOBAL__N_118TileGroupTestLargeEEE"
                      );
        bVar4 = iVar5 == 0;
      }
      bVar4 = IsTrue(bVar4);
      if (!bVar4) {
        GTestLog::GTestLog((GTestLog *)&local_80,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                           ,0x45e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33)
        ;
        GTestLog::~GTestLog((GTestLog *)&local_80);
      }
      pPVar6 = (ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge> *)
               __dynamic_cast(pPVar3,&ParameterizedTestSuiteInfoBase::typeinfo,
                              &ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge>
                               ::typeinfo,0);
      if (pPVar6 != (ParameterizedTestSuiteInfo<(anonymous_namespace)::TileGroupTestLarge> *)0x0) {
        return pPVar6;
      }
      goto LAB_0053bfd0;
    }
    ppPVar9 = ppPVar9 + 1;
  } while( true );
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      const char* test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;
    for (auto& test_suite_info : test_suite_infos_) {
      if (test_suite_info->GetTestSuiteName() == test_suite_name) {
        if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test suite setup and tear-down in this case.
          ReportInvalidTestSuiteType(test_suite_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestSuiteInfo<TestSuite>>(test_suite_info);
        }
        break;
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, code_location);
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }